

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

int __thiscall boost::filesystem::detail::remove(detail *this,char *__filename)

{
  bool bVar1;
  file_type type_00;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar2;
  err_t local_38;
  undefined1 local_30 [4];
  file_type type;
  error_code tmp_ec;
  error_code *ec_local;
  path *p_local;
  
  tmp_ec.m_cat = (error_category *)__filename;
  system::error_code::error_code((error_code *)local_30);
  type_00 = anon_unknown.dwarf_522f::query_file_type((path *)this,(error_code *)local_30);
  if (type_00 == status_error) {
    local_38 = system::error_code::value((error_code *)local_30);
  }
  else {
    local_38 = 0;
  }
  bVar1 = anon_unknown.dwarf_522f::error
                    (local_38,(path *)this,(error_code *)tmp_ec.m_cat,"boost::filesystem::remove");
  if (bVar1) {
    p_local._7_1_ = false;
    uVar2 = extraout_var;
  }
  else {
    p_local._7_1_ =
         anon_unknown.dwarf_522f::remove_file_or_directory
                   ((path *)this,type_00,(error_code *)tmp_ec.m_cat);
    uVar2 = extraout_var_00;
  }
  return (int)CONCAT71(uVar2,p_local._7_1_);
}

Assistant:

BOOST_FILESYSTEM_DECL
  bool remove(const path& p, error_code* ec)
  {
    error_code tmp_ec;
    file_type type = query_file_type(p, &tmp_ec);
    if (error(type == status_error ? tmp_ec.value() : 0, p, ec,
        "boost::filesystem::remove"))
      return false;

    // Since POSIX remove() is specified to work with either files or directories, in a
    // perfect world it could just be called. But some important real-world operating
    // systems (Windows, Mac OS X, for example) don't implement the POSIX spec. So
    // remove_file_or_directory() is always called to keep it simple.
    return remove_file_or_directory(p, type, ec);
  }